

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::TooLong(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
          *this,Ch *str,SizeType length,SizeType expected)

{
  CrtAllocator *pCVar1;
  Data local_48;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_38;
  
  if (this->stateAllocator_ == (CrtAllocator *)0x0) {
    pCVar1 = (CrtAllocator *)operator_new(1);
    this->ownStateAllocator_ = pCVar1;
    this->stateAllocator_ = pCVar1;
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue
            (&local_38,str,length,this->stateAllocator_);
  local_48._4_1_ = '\0';
  local_48._5_1_ = '\0';
  local_48._6_1_ = '\0';
  local_48._7_1_ = '\0';
  local_48._0_4_ = expected;
  local_48.s.str = (Ch *)((ulong)(-1 < (int)expected) << 0x35 | 0x1d6000000000000);
  AddNumberError(this,kValidateErrorMaxLength,&local_38,(SValue *)&local_48.s,
                 (_func_ValueType_ptr *)0x0);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_48.s);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_38);
  return;
}

Assistant:

void TooLong(const Ch* str, SizeType length, SizeType expected) {
        AddNumberError(kValidateErrorMaxLength,
            ValueType(str, length, GetStateAllocator()).Move(), SValue(expected).Move());
    }